

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O1

void populateAigPointerUnitGF
               (Aig_Man_t *pAigNew,ltlNode *topASTNode,Vec_Ptr_t *vSignal,Vec_Vec_t *vAigGFMap)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ltlNode_t *plVar4;
  ltlNode *pLtlNode;
  Aig_Obj_t *pAVar5;
  void **ppvVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  do {
    switch(topASTNode->type) {
    case AND:
    case OR:
    case IMPLY:
      populateAigPointerUnitGF(pAigNew,topASTNode->left,vSignal,vAigGFMap);
      topASTNode = topASTNode->right;
      break;
    case NOT:
      topASTNode = topASTNode->left;
      break;
    case GLOBALLY:
      goto switchD_0058aa86_caseD_4;
    default:
      puts("\nINVALID situation: aborting...");
      exit(0);
    case BOOL:
      return;
    }
  } while( true );
LAB_0058aca5:
  iVar9 = (int)uVar8;
  goto LAB_0058aca7;
switchD_0058aa86_caseD_4:
  plVar4 = topASTNode->left;
  plVar4->type = EVENTUALLY;
  pLtlNode = plVar4->left;
  pAVar5 = pLtlNode->pObj;
  if (pLtlNode->type != BOOL) {
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      __assert_fail("nextToNextNode->pObj == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x21a,
                    "void populateAigPointerUnitGF(Aig_Man_t *, ltlNode *, Vec_Ptr_t *, Vec_Vec_t *)"
                   );
    }
    buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode);
    pAVar5 = pLtlNode->pObj;
    uVar1 = vSignal->nSize;
    iVar9 = -1;
    if (0 < (long)(int)uVar1) {
      lVar7 = 0;
      do {
        if ((Aig_Obj_t *)vSignal->pArray[lVar7] == pAVar5) {
          iVar9 = (int)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
      } while ((int)uVar1 != lVar7);
    }
    if (iVar9 != -1) goto LAB_0058aca7;
    uVar2 = vSignal->nCap;
    if (uVar1 == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vSignal->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vSignal->pArray,0x80);
        }
        vSignal->pArray = ppvVar6;
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar2 * 2;
        if (iVar9 <= (int)uVar2) goto LAB_0058ac6b;
        if (vSignal->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vSignal->pArray,(ulong)uVar2 << 4);
        }
        vSignal->pArray = ppvVar6;
      }
      vSignal->nCap = iVar9;
    }
LAB_0058ac6b:
    iVar3 = vSignal->nSize;
    vSignal->nSize = iVar3 + 1U;
    vSignal->pArray[iVar3] = pAVar5;
    iVar9 = -1;
    if (-1 < (long)iVar3) {
      uVar8 = 0;
      do {
        if ((Aig_Obj_t *)vSignal->pArray[uVar8] == pLtlNode->pObj) goto LAB_0058aca5;
        uVar8 = uVar8 + 1;
      } while (iVar3 + 1U != uVar8);
    }
    goto LAB_0058aca7;
  }
  if (pAVar5 == (Aig_Obj_t *)0x0) {
    __assert_fail("nextToNextNode->pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                  ,0x20e,
                  "void populateAigPointerUnitGF(Aig_Man_t *, ltlNode *, Vec_Ptr_t *, Vec_Vec_t *)")
    ;
  }
  uVar1 = vSignal->nSize;
  iVar9 = -1;
  if (0 < (long)(int)uVar1) {
    lVar7 = 0;
    do {
      if ((Aig_Obj_t *)vSignal->pArray[lVar7] == pAVar5) {
        iVar9 = (int)lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
    } while ((int)uVar1 != lVar7);
  }
  if (iVar9 != -1) goto LAB_0058aca7;
  uVar2 = vSignal->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSignal->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vSignal->pArray,0x80);
      }
      vSignal->pArray = ppvVar6;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar2 * 2;
      if (iVar9 <= (int)uVar2) goto LAB_0058ac22;
      if (vSignal->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vSignal->pArray,(ulong)uVar2 << 4);
      }
      vSignal->pArray = ppvVar6;
    }
    vSignal->nCap = iVar9;
  }
LAB_0058ac22:
  iVar3 = vSignal->nSize;
  vSignal->nSize = iVar3 + 1U;
  vSignal->pArray[iVar3] = pAVar5;
  iVar9 = -1;
  if (-1 < (long)iVar3) {
    uVar8 = 0;
    do {
      if ((Aig_Obj_t *)vSignal->pArray[uVar8] == pLtlNode->pObj) goto LAB_0058aca5;
      uVar8 = uVar8 + 1;
    } while (iVar3 + 1U != uVar8);
  }
LAB_0058aca7:
  Vec_VecPush(vAigGFMap,iVar9,topASTNode);
  return;
}

Assistant:

void populateAigPointerUnitGF( Aig_Man_t *pAigNew, ltlNode *topASTNode, Vec_Ptr_t *vSignal, Vec_Vec_t *vAigGFMap )
{
	ltlNode *nextNode, *nextToNextNode;
	int serialNumSignal;

	switch( topASTNode->type ){
		case AND:
		case OR:
		case IMPLY:
			populateAigPointerUnitGF( pAigNew, topASTNode->left, vSignal, vAigGFMap );
			populateAigPointerUnitGF( pAigNew, topASTNode->right, vSignal, vAigGFMap );
			return;
		case NOT:
			populateAigPointerUnitGF( pAigNew, topASTNode->left, vSignal, vAigGFMap );
			return;
		case GLOBALLY:
			nextNode = topASTNode->left;
			assert( nextNode->type = EVENTUALLY );
			nextToNextNode = nextNode->left;
			if( nextToNextNode->type == BOOL )
			{
				assert( nextToNextNode->pObj );
				serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				if( serialNumSignal == -1 )
				{					
					Vec_PtrPush( vSignal, nextToNextNode->pObj );
					serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				}
				//Vec_PtrPush( vGLOBALLY, topASTNode );
				Vec_VecPush( vAigGFMap, serialNumSignal, topASTNode );
			}
			else
			{
				assert( nextToNextNode->pObj == NULL );
				buildLogicFromLTLNode_combinationalOnly( pAigNew, nextToNextNode );
				serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				if( serialNumSignal == -1 )
				{
					Vec_PtrPush( vSignal, nextToNextNode->pObj );
					serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				}
				//Vec_PtrPush( vGLOBALLY, topASTNode );
				Vec_VecPush( vAigGFMap, serialNumSignal, topASTNode );
			}
			return;
		case BOOL:
			return;
		default:
			printf("\nINVALID situation: aborting...\n");
			exit(0);
	}
}